

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_debug.c
# Opt level: O3

int lj_cf_debug_upvalueid(lua_State *L)

{
  int32_t iVar1;
  uint uVar2;
  GCfunc *pGVar3;
  void *p;
  
  pGVar3 = lj_lib_checkfunc(L,1);
  iVar1 = lj_lib_checkint(L,2);
  uVar2 = iVar1 - 1;
  if (uVar2 < (pGVar3->c).nupvalues) {
    if ((pGVar3->c).ffid == '\0') {
      p = *(void **)((long)pGVar3 + (ulong)uVar2 * 8 + 0x28);
    }
    else {
      p = (void *)((long)pGVar3 + (ulong)uVar2 * 8 + 0x30);
    }
    lua_pushlightuserdata(L,p);
    return 1;
  }
  lj_err_arg(L,2,LJ_ERR_IDXRNG);
}

Assistant:

LJLIB_CF(debug_upvalueid)
{
  GCfunc *fn = lj_lib_checkfunc(L, 1);
  int32_t n = lj_lib_checkint(L, 2) - 1;
  if ((uint32_t)n >= fn->l.nupvalues)
    lj_err_arg(L, 2, LJ_ERR_IDXRNG);
  lua_pushlightuserdata(L, isluafunc(fn) ? (void *)gcref(fn->l.uvptr[n]) :
					   (void *)&fn->c.upvalue[n]);
  return 1;
}